

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits>::flush
          (iterator_buffer<char_*,_char,_fmt::v7::detail::fixed_buffer_traits> *this)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long __n2;
  ulong __n;
  char *__dest;
  
  uVar1 = (this->super_buffer<char>).size_;
  sVar2 = (this->super_fixed_buffer_traits).count_;
  __n = (this->super_fixed_buffer_traits).limit_ - sVar2;
  (this->super_fixed_buffer_traits).count_ = sVar2 + uVar1;
  if (uVar1 <= __n) {
    __n = uVar1;
  }
  __dest = this->out_;
  if (__n != 0) {
    memmove(__dest,this->data_,__n);
    __dest = __dest + __n;
  }
  this->out_ = __dest;
  (this->super_buffer<char>).size_ = 0;
  return;
}

Assistant:

void iterator_buffer<OutputIt, T, Traits>::flush() {
  out_ = std::copy_n(data_, this->limit(this->size()), out_);
  this->clear();
}